

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>::AddMapping
          (ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> *this,char *name,
          eChSetpointMode enumid)

{
  ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode> mpair;
  ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode> CStack_38;
  
  ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>::ChEnumNamePair
            (&CStack_38,name,enumid);
  std::
  vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>
  ::push_back((this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&CStack_38);
  std::__cxx11::string::~string((string *)&CStack_38);
  return;
}

Assistant:

void AddMapping(const char* name, Te enumid) {
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }